

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O3

void __thiscall TypesHierarchy::AddRelation(TypesHierarchy *this,TYPE_ID type,TYPE_ID parent)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  TYPE_ID local_c [2];
  TYPE_ID type_local;
  
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            ((this->types).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + parent);
  __position._M_current = *(uint **)(this_00 + 8);
  if (__position._M_current == *(uint **)(this_00 + 0x10)) {
    local_c[0] = type;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (this_00,__position,local_c);
  }
  else {
    *__position._M_current = type;
    *(uint **)(this_00 + 8) = __position._M_current + 1;
  }
  return;
}

Assistant:

void TypesHierarchy::AddRelation(TYPE_ID type, TYPE_ID parent) {
//	types[type].push_back(parent);
	types[parent].push_back(type);
}